

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

void __thiscall
embree::SceneGraph::AnimatedPerspectiveCameraNode::print
          (AnimatedPerspectiveCameraNode *this,ostream *cout,int depth)

{
  int n;
  string *__lhs;
  PerspectiveCameraNode *pPVar1;
  bool bVar2;
  ostream *poVar3;
  size_t i;
  ulong uVar4;
  
  poVar3 = std::operator<<(cout,"AnimatedPerspectiveCameraNode @ ");
  poVar3 = std::ostream::_M_insert<void_const*>(poVar3);
  poVar3 = std::operator<<(poVar3," { ");
  std::endl<char,std::char_traits<char>>(poVar3);
  __lhs = &(this->super_PerspectiveCameraNode).super_Node.name;
  bVar2 = std::operator!=(__lhs,"");
  n = depth + 1;
  if (bVar2) {
    tab(cout,n);
    poVar3 = std::operator<<(cout,"name = ");
    poVar3 = std::operator<<(poVar3,(string *)__lhs);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(this->cameras).
                            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->cameras).
                            super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
    tab(cout,n);
    pPVar1 = (this->cameras).
             super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar4].ptr;
    (**(code **)((long)(pPVar1->super_Node).super_RefCount._vptr_RefCount + 0x20))(pPVar1,cout,n);
  }
  tab(cout,depth);
  poVar3 = std::operator<<(cout,"}");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void SceneGraph::AnimatedPerspectiveCameraNode::print(std::ostream& cout, int depth) {
    cout << "AnimatedPerspectiveCameraNode @ " << this << " { " << std::endl;
    if (name != "") {
      tab(cout, depth+1); cout << "name = " << name << std::endl;
    }
    for (size_t i=0; i<cameras.size(); i++) {
      tab(cout,depth+1); cameras[i]->print(cout,depth+1);
    }
    tab(cout, depth); cout << "}" << std::endl;
  }